

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cayley.cpp
# Opt level: O3

rotation_t * opengv::math::cayley2rot(cayley_t *cayley)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ActualDstType actualDst;
  rotation_t *R;
  rotation_t *in_RDI;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  
  dVar1 = (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[0];
  auVar6._8_8_ = dVar1;
  auVar6._0_8_ = dVar1;
  auVar2 = *(undefined1 (*) [16])
            ((cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
             .array + 1);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[2];
  dVar8 = auVar2._0_8_;
  dVar3 = dVar8 * dVar8;
  auVar11._0_8_ = dVar8 * dVar8;
  auVar11._8_8_ = auVar2._8_8_ * auVar2._8_8_;
  auVar4 = vshufpd_avx(auVar2,auVar2,1);
  auVar5 = vfmsub213pd_fma(auVar4,auVar6,auVar2);
  dVar8 = dVar1 * dVar1 + 1.0;
  auVar4 = vshufpd_avx(auVar11,auVar11,1);
  dVar1 = 1.0 - dVar1 * dVar1;
  dVar10 = auVar4._0_8_;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       (dVar8 - dVar3) - dVar10;
  auVar4 = vfmadd213sd_fma(auVar9,auVar6,auVar2);
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       auVar4._0_8_ + auVar4._0_8_;
  auVar4 = vfmadd213sd_fma(auVar2,auVar6,auVar9);
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1] =
       auVar4._0_8_ + auVar4._0_8_;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       (dVar1 + dVar3) - dVar10;
  auVar4 = vfmsub213sd_fma(auVar9,auVar2,auVar6);
  auVar2 = vfmadd213sd_fma(auVar9,auVar2,auVar6);
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       auVar4._0_8_ + auVar4._0_8_;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] =
       auVar2._0_8_ + auVar2._0_8_;
  dVar7 = 1.0 / (dVar10 + dVar8 + dVar3);
  dVar8 = (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[1];
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar7 * (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[0];
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1] =
       dVar7 * dVar8;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
       dVar7 * (auVar5._0_8_ + auVar5._0_8_);
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       dVar7 * (auVar5._8_8_ + auVar5._8_8_);
  dVar8 = (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[5];
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       dVar7 * (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[4];
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] =
       dVar7 * dVar8;
  dVar8 = (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[7];
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       dVar7 * (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[6];
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       dVar7 * dVar8;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       dVar7 * (dVar10 + (dVar1 - dVar3));
  return in_RDI;
}

Assistant:

opengv::rotation_t
opengv::math::cayley2rot( const cayley_t & cayley)
{
  rotation_t R;
  double scale = 1+pow(cayley[0],2)+pow(cayley[1],2)+pow(cayley[2],2);

  R(0,0) = 1+pow(cayley[0],2)-pow(cayley[1],2)-pow(cayley[2],2);
  R(0,1) = 2*(cayley[0]*cayley[1]-cayley[2]);
  R(0,2) = 2*(cayley[0]*cayley[2]+cayley[1]);
  R(1,0) = 2*(cayley[0]*cayley[1]+cayley[2]);
  R(1,1) = 1-pow(cayley[0],2)+pow(cayley[1],2)-pow(cayley[2],2);
  R(1,2) = 2*(cayley[1]*cayley[2]-cayley[0]);
  R(2,0) = 2*(cayley[0]*cayley[2]-cayley[1]);
  R(2,1) = 2*(cayley[1]*cayley[2]+cayley[0]);
  R(2,2) = 1-pow(cayley[0],2)-pow(cayley[1],2)+pow(cayley[2],2);

  R = (1/scale) * R;
  return R;
}